

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestInfo *pTVar2;
  pointer piVar3;
  pointer ppTVar4;
  ostream *poVar5;
  pointer ppTVar6;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *extraout_RDX;
  TestResult *extraout_RDX_00;
  TestResult *extraout_RDX_01;
  TestResult *result;
  uint uVar7;
  long lVar8;
  undefined1 local_98 [8];
  string kTestsuite;
  int local_54;
  string local_50;
  
  local_98 = (undefined1  [8])&kTestsuite._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"testsuite","");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  <",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,(char *)local_98,(long)kTestsuite._M_dataplus._M_p);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"name","");
  std::__cxx11::string::string
            ((string *)(kTestsuite.field_2._M_local_buf + 8),(test_suite->name_)._M_dataplus._M_p,
             (allocator *)&local_54);
  OutputXmlAttribute(stream,(string *)local_98,&local_50,(string *)((long)&kTestsuite.field_2 + 8));
  if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kTestsuite.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tests","");
  ppTVar4 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar6 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar4 == ppTVar6) {
    local_54 = 0;
  }
  else {
    local_54 = 0;
    do {
      uVar7 = (*ppTVar4)->is_in_another_shard_ ^ 1;
      if ((*ppTVar4)->matches_filter_ == false) {
        uVar7 = 0;
      }
      local_54 = local_54 + uVar7;
      ppTVar4 = ppTVar4 + 1;
    } while (ppTVar4 != ppTVar6);
  }
  StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_54);
  OutputXmlAttribute(stream,(string *)local_98,&local_50,(string *)((long)&kTestsuite.field_2 + 8));
  if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
    operator_delete((void *)kTestsuite.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (FLAGS_gtest_list_tests == '\0') {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"failures","");
    local_54 = TestSuite::failed_test_count(test_suite);
    StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_54);
    OutputXmlAttribute(stream,(string *)local_98,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kTestsuite.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"disabled","");
    local_54 = 0;
    for (ppTVar4 = (test_suite->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar4 !=
        (test_suite->test_info_list_).
        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar4 = ppTVar4 + 1) {
      pTVar2 = *ppTVar4;
      uVar7 = 0;
      if ((pTVar2->matches_filter_ == true) && ((pTVar2->is_in_another_shard_ & 1U) == 0)) {
        uVar7 = (uint)pTVar2->is_disabled_;
      }
      local_54 = local_54 + uVar7;
    }
    StreamableToString<int>((string *)((long)&kTestsuite.field_2 + 8),&local_54);
    OutputXmlAttribute(stream,(string *)local_98,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kTestsuite.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"errors","");
    kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&kTestsuite.field_2 + 8),"0","");
    OutputXmlAttribute(stream,(string *)local_98,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kTestsuite.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"time","");
    FormatTimeInMillisAsSeconds_abi_cxx11_
              ((string *)((long)&kTestsuite.field_2 + 8),(internal *)test_suite->elapsed_time_,ms);
    OutputXmlAttribute(stream,(string *)local_98,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kTestsuite.field_2._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"timestamp","");
    FormatEpochTimeInMillisAsIso8601_abi_cxx11_
              ((string *)((long)&kTestsuite.field_2 + 8),(internal *)test_suite->start_timestamp_,
               ms_00);
    OutputXmlAttribute(stream,(string *)local_98,&local_50,(string *)((long)&kTestsuite.field_2 + 8)
                      );
    result = extraout_RDX;
    if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kTestsuite.field_2._8_8_);
      result = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
      result = extraout_RDX_01;
    }
    TestPropertiesAsXmlAttributes_abi_cxx11_
              (&local_50,(XmlUnitTestResultPrinter *)&test_suite->ad_hoc_test_result_,result);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
  ppTVar4 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar6 = (test_suite->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppTVar6 - (long)ppTVar4) >> 3)) {
    lVar8 = 0;
    do {
      piVar3 = (test_suite->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (((lVar8 < (int)((ulong)((long)(test_suite->test_indices_).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar3) >> 2)) &&
          (pTVar2 = ppTVar4[(uint)piVar3[lVar8]], pTVar2->matches_filter_ == true)) &&
         ((pTVar2->is_in_another_shard_ & 1U) == 0)) {
        OutputXmlTestInfo(stream,(test_suite->name_)._M_dataplus._M_p,pTVar2);
        ppTVar4 = (test_suite->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppTVar6 = (test_suite->test_info_list_).
                  super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)((ulong)((long)ppTVar6 - (long)ppTVar4) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"  </",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_98,(long)kTestsuite._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,">\n",2);
  if (local_98 != (undefined1  [8])&kTestsuite._M_string_length) {
    operator_delete((void *)local_98);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestSuite(std::ostream* stream,
                                                 const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_suite.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_suite.reportable_test_count()));
  if (!GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "failures",
                       StreamableToString(test_suite.failed_test_count()));
    OutputXmlAttribute(
        stream, kTestsuite, "disabled",
        StreamableToString(test_suite.reportable_disabled_test_count()));
    OutputXmlAttribute(stream, kTestsuite, "errors", "0");
    OutputXmlAttribute(stream, kTestsuite, "time",
                       FormatTimeInMillisAsSeconds(test_suite.elapsed_time()));
    OutputXmlAttribute(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsIso8601(test_suite.start_timestamp()));
    *stream << TestPropertiesAsXmlAttributes(test_suite.ad_hoc_test_result());
  }
  *stream << ">\n";
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}